

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_uses(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  lysp_node *plVar1;
  lysp_ext_instance *object;
  LY_ERR LVar2;
  lysp_node *parent;
  lysp_node **pplVar3;
  lysp_node *plVar4;
  tree_node_meta augments;
  yin_subelement subelems [8];
  lysp_node *local_f8;
  uint16_t *local_f0;
  yin_subelement local_e8;
  undefined4 local_d0;
  char **local_c8;
  undefined2 local_c0;
  undefined4 local_b8;
  lysp_qname **local_b0;
  undefined2 local_a8;
  undefined4 local_a0;
  char **local_98;
  undefined2 local_90;
  undefined4 local_88;
  lysp_node *local_80;
  undefined2 local_78;
  undefined4 local_70;
  uint16_t *local_68;
  undefined2 local_60;
  undefined4 local_58;
  lysp_node **local_50;
  undefined2 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  parent = (lysp_node *)calloc(1,0x58);
  if (parent == (lysp_node *)0x0) {
    LVar2 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_uses");
  }
  else {
    pplVar3 = node_meta->nodes;
    plVar1 = *pplVar3;
    if (*pplVar3 != (lysp_node *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = plVar4->next;
      } while (plVar1 != (lysp_node *)0x0);
      pplVar3 = &plVar4->next;
    }
    *pplVar3 = parent;
    parent->nodetype = 0x800;
    parent->parent = node_meta->parent;
    LVar2 = lyxml_ctx_next(ctx->xmlctx);
    if ((LVar2 == LY_SUCCESS) &&
       (LVar2 = yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_PREF_IDENTIF_ARG,LY_STMT_USES),
       LVar2 == LY_SUCCESS)) {
      local_e8.dest = &local_f8;
      local_f0 = &parent[1].nodetype;
      local_e8.type = LY_STMT_AUGMENT;
      local_e8.flags = 0;
      local_d0 = 0x80000;
      local_c8 = &parent->dsc;
      local_c0 = 2;
      local_b8 = 0x130000;
      local_b0 = &parent->iffeatures;
      local_a8 = 0;
      local_a0 = 0x270000;
      local_98 = &parent->ref;
      local_90 = 2;
      local_88 = 0x280000;
      local_80 = parent + 1;
      local_78 = 0;
      local_70 = 0x2c0000;
      local_68 = &parent->flags;
      local_60 = 2;
      local_58 = 0x330000;
      local_50 = &parent[1].next;
      local_48 = 2;
      uStack_38 = 0;
      local_30 = 0;
      local_40 = 0xf0000;
      local_f8 = parent;
      LVar2 = yin_parse_content(ctx,&local_e8,8,parent,LY_STMT_USES,(char **)0x0,&parent->exts);
      if (LVar2 == LY_SUCCESS) {
        object = parent->exts;
        if (object != (lysp_ext_instance *)0x0) {
          LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
          if (LVar2 != LY_SUCCESS) {
            return LVar2 + (LVar2 == LY_SUCCESS);
          }
        }
        LVar2 = LY_SUCCESS;
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_uses(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    struct lysp_node_uses *uses;

    /* create new uses */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, uses, next, LY_EMEM);
    uses->nodetype = LYS_USES;
    uses->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &uses->name, Y_PREF_IDENTIF_ARG, LY_STMT_USES));

    /* parse content */
    struct tree_node_meta augments = {(struct lysp_node *)uses, (struct lysp_node **)&uses->augments};
    struct yin_subelement subelems[] = {
        {LY_STMT_AUGMENT, &augments, 0},
        {LY_STMT_DESCRIPTION, &uses->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &uses->iffeatures, 0},
        {LY_STMT_REFERENCE, &uses->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFINE, &uses->refines, 0},
        {LY_STMT_STATUS, &uses->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_WHEN, &uses->when, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), uses, LY_STMT_USES, NULL, &uses->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, uses->exts));

    return LY_SUCCESS;
}